

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

float google::protobuf::io::SafeDoubleToFloat(double value)

{
  if (3.4028234663852886e+38 < value) {
    return INFINITY;
  }
  if (value < -3.4028234663852886e+38) {
    return -INFINITY;
  }
  return (float)value;
}

Assistant:

float SafeDoubleToFloat(double value) {
  if (value > std::numeric_limits<float>::max()) {
    return std::numeric_limits<float>::infinity();
  } else if (value < -std::numeric_limits<float>::max()) {
    return -std::numeric_limits<float>::infinity();
  } else {
    return static_cast<float>(value);
  }
}